

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,string *name,double *def_val)

{
  const_iterator cVar1;
  ostringstream ostr;
  string local_1c0;
  string local_1a0 [11];
  
  trim_leading_dashes(local_1a0,this,name);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->params_)._M_t,local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  if (&(this->params_)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)cVar1._M_node) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    *(undefined8 *)
     ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) =
         0x15;
    std::ostream::_M_insert<double>(*def_val);
    std::__cxx11::stringbuf::str();
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  else {
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,(string *)(cVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

string_stream parser::operator()(std::string const& name, T&& def_val) const
   {
      auto optIt = params_.find(trim_leading_dashes(name));
      if (params_.end() != optIt)
         return string_stream(optIt->second);

      std::ostringstream ostr;
      ostr.precision(std::numeric_limits<long double>::max_digits10);
      ostr << def_val;
      return string_stream(ostr.str()); // use default
   }